

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_ascii(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  FILE *__stream;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  char *pcVar1;
  char *pcVar2;
  uint dc;
  uint dz;
  uint dy;
  uint dx;
  double val;
  CImg<char> line;
  
  if (file != (FILE *)0x0 || filename != (char *)0x0) {
    __stream = (FILE *)file;
    if (file == (FILE *)0x0) {
      __stream = cimg::fopen(filename,"rb");
    }
    CImg<char>::CImg(&line,0x100,1,1,1);
    *line._data = '\0';
    __isoc99_fscanf(__stream,"%255[^\n]",line._data);
    __isoc99_sscanf(line._data,"%u%*c%u%*c%u%*c%u");
    __isoc99_fscanf(__stream,"%*[^0-9.eEinfa+-]");
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar1 = "non-";
    if (this->_is_shared != false) {
      pcVar1 = "";
    }
    pcVar2 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar2 = filename;
    }
    CImgIOException::CImgIOException
              (this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_ascii(): Invalid Ascii header in file \'%s\', image dimensions are set to (%u,%u,%u,%u)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar1,"unsigned char",pcVar2,0,1,1,1);
    __cxa_throw(this_01,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
  pcVar1 = "non-";
  if (this->_is_shared != false) {
    pcVar1 = "";
  }
  CImgArgumentException::CImgArgumentException
            (this_00,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_ascii(): Specified filename is (null)."
             ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar1,"unsigned char");
  __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
}

Assistant:

CImg<T>& _load_ascii(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_ascii(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      CImg<charT> line(256); *line = 0;
      int err = std::fscanf(nfile,"%255[^\n]",line._data);
      unsigned int dx = 0, dy = 1, dz = 1, dc = 1;
      cimg_sscanf(line,"%u%*c%u%*c%u%*c%u",&dx,&dy,&dz,&dc);
      err = std::fscanf(nfile,"%*[^0-9.eEinfa+-]");
      if (!dx || !dy || !dz || !dc) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_ascii(): Invalid Ascii header in file '%s', image dimensions are set "
                              "to (%u,%u,%u,%u).",
                              cimg_instance,
                              filename?filename:"(FILE*)",dx,dy,dz,dc);
      }
      assign(dx,dy,dz,dc);
      const ulongT siz = size();
      ulongT off = 0;
      double val;
      T *ptr = _data;
      for (err = 1, off = 0; off<siz && err==1; ++off) {
        err = std::fscanf(nfile,"%lf%*[^0-9.eEinfa+-]",&val);
        *(ptr++) = (T)val;
      }
      if (err!=1)
        cimg::warn(_cimg_instance
                   "load_ascii(): Only %lu/%lu values read from file '%s'.",
                   cimg_instance,
                   off - 1,siz,filename?filename:"(FILE*)");

      if (!file) cimg::fclose(nfile);
      return *this;
    }